

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.h
# Opt level: O2

bool __thiscall cert::Sphere::intersects(Sphere *this,Ray *r,float t_min,float t_max)

{
  double dVar1;
  byte bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Vec3 VVar7;
  float local_68;
  float fStack_64;
  double local_28;
  
  VVar7 = operator-(&r->origin,&this->center);
  fVar4 = VVar7.z;
  fVar3 = dot(&r->direction,&r->direction);
  local_68 = VVar7.x;
  fStack_64 = VVar7.y;
  fVar6 = (r->direction).z * fVar4 + (r->direction).x * local_68 + (r->direction).y * fStack_64;
  fVar4 = fVar6 * fVar6 -
          ((fVar4 * fVar4 + local_68 * local_68 + fStack_64 * fStack_64) -
          this->radius * this->radius) * fVar3;
  if (fVar4 <= 0.0) {
    bVar2 = 0;
  }
  else {
    dVar1 = sqrt((double)(ulong)(uint)fVar4);
    fVar5 = (-fVar6 - SUB84(dVar1,0)) / fVar3;
    if ((t_max <= fVar5) || (bVar2 = 1, fVar5 <= t_min)) {
      local_28 = (double)(ulong)(uint)fVar4;
      dVar1 = sqrt(local_28);
      fVar3 = (SUB84(dVar1,0) - fVar6) / fVar3;
      bVar2 = -(fVar3 < t_max && t_min < fVar3);
    }
  }
  return (bool)(bVar2 & 1);
}

Assistant:

constexpr virtual bool intersects (const Ray& r, float t_min, float t_max) const
	{
		Vec3 oc = r.origin - center;
		float a = dot (r.direction, r.direction);
		float b = dot (oc, r.direction);
		float c = dot (oc, oc) - radius * radius;
		float discriminant = b * b - a * c;
		if (discriminant <= 0) return false;
		float negative = (-b - sqrt (discriminant)) / a;
		if (negative < t_max && negative > t_min)
		{
			return true;
		}
		float positive = (-b + sqrt (discriminant)) / a;
		if (positive < t_max && positive > t_min)
		{
			return true;
		}
		return false;
	}